

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  uint uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  float fVar4;
  ImRect IVar5;
  
  IVar5 = ImGuiWindow::Rect(window);
  fVar4 = (&(window->ScrollbarSizes).x)[axis ^ ImGuiAxis_Y];
  IVar2.y = IVar5.Max.y;
  if (axis == ImGuiAxis_X) {
    fVar4 = (IVar2.y - window->WindowBorderSize) - fVar4;
    uVar1 = -(uint)(fVar4 <= IVar5.Min.y);
    IVar3.y = (float)(uVar1 & (uint)IVar5.Min.y | ~uVar1 & (uint)fVar4);
    IVar3.x = (window->InnerRect).Min.x;
    IVar2.x = (window->InnerRect).Max.x;
  }
  else {
    fVar4 = (IVar5.Max.x - window->WindowBorderSize) - fVar4;
    uVar1 = -(uint)(fVar4 <= IVar5.Min.x);
    IVar3.x = (float)(uVar1 & (uint)IVar5.Min.x | ~uVar1 & (uint)fVar4);
    IVar2.x = IVar5.Max.x + -0.1;
    IVar2.y = (window->InnerRect).Max.y;
    IVar3.y = (window->InnerRect).Min.y;
  }
  IVar5.Max = IVar2;
  IVar5.Min = IVar3;
  return IVar5;
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x - 0.1f, inner_rect.Max.y);
}